

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Ref<embree::Geometry> *pRVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint uVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 (*pauVar25) [16];
  byte bVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 (*pauVar37) [16];
  ulong uVar38;
  size_t i;
  long lVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  float fVar48;
  float fVar53;
  float fVar54;
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar55;
  undefined1 auVar52 [32];
  float fVar56;
  float fVar62;
  float fVar63;
  vint4 bi;
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  float fVar64;
  undefined1 auVar61 [32];
  vint4 ai;
  undefined1 auVar66 [32];
  undefined1 auVar65 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  vint4 bi_1;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined1 local_1360 [8];
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [8];
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  undefined4 uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined4 uStack_fe4;
  float local_fe0 [4];
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  undefined4 uStack_fc4;
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  ulong uVar31;
  
  pauVar37 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar41._4_4_ = fVar2;
  auVar41._0_4_ = fVar2;
  auVar41._8_4_ = fVar2;
  auVar41._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar42._4_4_ = fVar3;
  auVar42._0_4_ = fVar3;
  auVar42._8_4_ = fVar3;
  auVar42._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar43._4_4_ = fVar4;
  auVar43._0_4_ = fVar4;
  auVar43._8_4_ = fVar4;
  auVar43._12_4_ = fVar4;
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar4 = fVar4 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar27 = (tray->tfar).field_0.i[k];
  auVar81 = ZEXT1664(CONCAT412(iVar27,CONCAT48(iVar27,CONCAT44(iVar27,iVar27))));
  auVar44._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar44._8_4_ = -fVar2;
  auVar44._12_4_ = -fVar2;
  auVar45._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar45._8_4_ = -fVar3;
  auVar45._12_4_ = -fVar3;
  auVar46._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  auVar46._8_4_ = -fVar4;
  auVar46._12_4_ = -fVar4;
  iVar27 = (tray->tnear).field_0.i[k];
  auVar85._4_4_ = iVar27;
  auVar85._0_4_ = iVar27;
  auVar85._8_4_ = iVar27;
  auVar85._12_4_ = iVar27;
  local_1280._16_16_ = mm_lookupmask_ps._240_16_;
  local_1280._0_16_ = mm_lookupmask_ps._0_16_;
  auVar66._8_4_ = 0x3f800000;
  auVar66._0_8_ = 0x3f8000003f800000;
  auVar66._12_4_ = 0x3f800000;
  auVar66._16_4_ = 0x3f800000;
  auVar66._20_4_ = 0x3f800000;
  auVar66._24_4_ = 0x3f800000;
  auVar66._28_4_ = 0x3f800000;
  auVar80._8_4_ = 0xbf800000;
  auVar80._0_8_ = 0xbf800000bf800000;
  auVar80._12_4_ = 0xbf800000;
  auVar80._16_4_ = 0xbf800000;
  auVar80._20_4_ = 0xbf800000;
  auVar80._24_4_ = 0xbf800000;
  auVar80._28_4_ = 0xbf800000;
  _local_12a0 = vblendvps_avx(auVar66,auVar80,local_1280);
LAB_01581dc7:
  do {
    do {
      if (pauVar37 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar25 = pauVar37 + -1;
      pauVar37 = pauVar37 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar25 + 8));
    uVar33 = *(ulong *)*pauVar37;
    while ((uVar33 & 8) == 0) {
      auVar49 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar33 + 0x20 + uVar35),auVar44,auVar41);
      auVar57 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar33 + 0x20 + uVar36),auVar45,auVar42);
      auVar49 = vpmaxsd_avx(auVar49,auVar57);
      auVar57 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar33 + 0x20 + uVar38),auVar46,auVar43);
      auVar57 = vpmaxsd_avx(auVar57,auVar85);
      auVar57 = vpmaxsd_avx(auVar49,auVar57);
      auVar49 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar33 + 0x20 + (uVar35 ^ 0x10)),auVar44,
                                auVar41);
      auVar65 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar33 + 0x20 + (uVar36 ^ 0x10)),auVar45,
                                auVar42);
      auVar49 = vpminsd_avx(auVar49,auVar65);
      auVar65 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar33 + 0x20 + (uVar38 ^ 0x10)),auVar46,
                                auVar43);
      auVar65 = vpminsd_avx(auVar65,auVar81._0_16_);
      auVar49 = vpminsd_avx(auVar49,auVar65);
      auVar49 = vpcmpgtd_avx(auVar57,auVar49);
      iVar27 = vmovmskps_avx(auVar49);
      local_1180._0_16_ = auVar57;
      if (iVar27 == 0xf) goto LAB_01581dc7;
      bVar26 = (byte)iVar27 ^ 0xf;
      uVar40 = uVar33 & 0xfffffffffffffff0;
      lVar39 = 0;
      for (uVar33 = (ulong)bVar26; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
        lVar39 = lVar39 + 1;
      }
      uVar33 = *(ulong *)(uVar40 + lVar39 * 8);
      uVar28 = bVar26 - 1 & (uint)bVar26;
      uVar31 = (ulong)uVar28;
      if (uVar28 != 0) {
        uVar29 = *(uint *)(local_1180 + lVar39 * 4);
        lVar39 = 0;
        for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
          lVar39 = lVar39 + 1;
        }
        uVar28 = uVar28 - 1 & uVar28;
        uVar32 = (ulong)uVar28;
        uVar31 = *(ulong *)(uVar40 + lVar39 * 8);
        uVar30 = *(uint *)(local_1180 + lVar39 * 4);
        if (uVar28 == 0) {
          if (uVar29 < uVar30) {
            *(ulong *)*pauVar37 = uVar31;
            *(uint *)(*pauVar37 + 8) = uVar30;
            pauVar37 = pauVar37 + 1;
          }
          else {
            *(ulong *)*pauVar37 = uVar33;
            *(uint *)(*pauVar37 + 8) = uVar29;
            pauVar37 = pauVar37 + 1;
            uVar33 = uVar31;
          }
        }
        else {
          auVar49._8_8_ = 0;
          auVar49._0_8_ = uVar33;
          auVar49 = vpunpcklqdq_avx(auVar49,ZEXT416(uVar29));
          auVar57._8_8_ = 0;
          auVar57._0_8_ = uVar31;
          auVar57 = vpunpcklqdq_avx(auVar57,ZEXT416(uVar30));
          lVar39 = 0;
          for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
            lVar39 = lVar39 + 1;
          }
          uVar28 = uVar28 - 1 & uVar28;
          uVar33 = (ulong)uVar28;
          auVar65._8_8_ = 0;
          auVar65._0_8_ = *(ulong *)(uVar40 + lVar39 * 8);
          auVar8 = vpunpcklqdq_avx(auVar65,ZEXT416(*(uint *)(local_1180 + lVar39 * 4)));
          auVar65 = vpcmpgtd_avx(auVar57,auVar49);
          if (uVar28 == 0) {
            auVar72 = vpshufd_avx(auVar65,0xaa);
            auVar65 = vblendvps_avx(auVar57,auVar49,auVar72);
            auVar49 = vblendvps_avx(auVar49,auVar57,auVar72);
            auVar57 = vpcmpgtd_avx(auVar8,auVar65);
            auVar72 = vpshufd_avx(auVar57,0xaa);
            auVar57 = vblendvps_avx(auVar8,auVar65,auVar72);
            auVar65 = vblendvps_avx(auVar65,auVar8,auVar72);
            auVar8 = vpcmpgtd_avx(auVar65,auVar49);
            auVar72 = vpshufd_avx(auVar8,0xaa);
            auVar8 = vblendvps_avx(auVar65,auVar49,auVar72);
            auVar49 = vblendvps_avx(auVar49,auVar65,auVar72);
            *pauVar37 = auVar49;
            pauVar37[1] = auVar8;
            uVar33 = auVar57._0_8_;
            pauVar37 = pauVar37 + 2;
          }
          else {
            lVar39 = 0;
            for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
              lVar39 = lVar39 + 1;
            }
            auVar72._8_8_ = 0;
            auVar72._0_8_ = *(ulong *)(uVar40 + lVar39 * 8);
            auVar9 = vpunpcklqdq_avx(auVar72,ZEXT416(*(uint *)(local_1180 + lVar39 * 4)));
            auVar72 = vpshufd_avx(auVar65,0xaa);
            auVar65 = vblendvps_avx(auVar57,auVar49,auVar72);
            auVar49 = vblendvps_avx(auVar49,auVar57,auVar72);
            auVar57 = vpcmpgtd_avx(auVar9,auVar8);
            auVar72 = vpshufd_avx(auVar57,0xaa);
            auVar57 = vblendvps_avx(auVar9,auVar8,auVar72);
            auVar8 = vblendvps_avx(auVar8,auVar9,auVar72);
            auVar72 = vpcmpgtd_avx(auVar8,auVar49);
            auVar9 = vpshufd_avx(auVar72,0xaa);
            auVar72 = vblendvps_avx(auVar8,auVar49,auVar9);
            auVar49 = vblendvps_avx(auVar49,auVar8,auVar9);
            auVar8 = vpcmpgtd_avx(auVar57,auVar65);
            auVar9 = vpshufd_avx(auVar8,0xaa);
            auVar8 = vblendvps_avx(auVar57,auVar65,auVar9);
            auVar57 = vblendvps_avx(auVar65,auVar57,auVar9);
            auVar65 = vpcmpgtd_avx(auVar72,auVar57);
            auVar9 = vpshufd_avx(auVar65,0xaa);
            auVar65 = vblendvps_avx(auVar72,auVar57,auVar9);
            auVar57 = vblendvps_avx(auVar57,auVar72,auVar9);
            *pauVar37 = auVar49;
            pauVar37[1] = auVar57;
            pauVar37[2] = auVar65;
            uVar33 = auVar8._0_8_;
            pauVar37 = pauVar37 + 3;
          }
        }
      }
    }
    uVar40 = uVar33 & 0xfffffffffffffff0;
    for (lVar39 = 0; lVar39 != (ulong)((uint)uVar33 & 0xf) - 8; lVar39 = lVar39 + 1) {
      lVar34 = lVar39 * 0xe0;
      lVar1 = uVar40 + 0xd0 + lVar34;
      local_11c0 = *(undefined8 *)(lVar1 + 0x10);
      uStack_11b8 = *(undefined8 *)(lVar1 + 0x18);
      lVar1 = uVar40 + 0xc0 + lVar34;
      local_11a0 = *(undefined8 *)(lVar1 + 0x10);
      uStack_1198 = *(undefined8 *)(lVar1 + 0x18);
      uStack_1190 = local_11a0;
      uStack_1188 = uStack_1198;
      uStack_11b0 = local_11c0;
      uStack_11a8 = uStack_11b8;
      auVar50._16_16_ = *(undefined1 (*) [16])(uVar40 + 0x60 + lVar34);
      auVar50._0_16_ = *(undefined1 (*) [16])(uVar40 + lVar34);
      auVar49 = *(undefined1 (*) [16])(uVar40 + 0x70 + lVar34);
      auVar58._16_16_ = auVar49;
      auVar58._0_16_ = *(undefined1 (*) [16])(uVar40 + 0x10 + lVar34);
      auVar57 = *(undefined1 (*) [16])(uVar40 + 0x80 + lVar34);
      auVar67._16_16_ = auVar57;
      auVar67._0_16_ = *(undefined1 (*) [16])(uVar40 + 0x20 + lVar34);
      auVar65 = *(undefined1 (*) [16])(uVar40 + 0x30 + lVar34);
      auVar69._16_16_ = auVar65;
      auVar69._0_16_ = auVar65;
      auVar65 = *(undefined1 (*) [16])(uVar40 + 0x40 + lVar34);
      auVar73._16_16_ = auVar65;
      auVar73._0_16_ = auVar65;
      auVar65 = *(undefined1 (*) [16])(uVar40 + 0x50 + lVar34);
      auVar77._16_16_ = auVar65;
      auVar77._0_16_ = auVar65;
      auVar65 = *(undefined1 (*) [16])(uVar40 + 0x90 + lVar34);
      auVar47._16_16_ = auVar65;
      auVar47._0_16_ = auVar65;
      lVar1 = uVar40 + 0xa0 + lVar34;
      pauVar25 = (undefined1 (*) [16])(lVar1 + 0x10);
      uStack_1350 = *(undefined8 *)*pauVar25;
      _local_1360 = *pauVar25;
      uStack_1348 = *(undefined8 *)(lVar1 + 0x18);
      auVar65 = *(undefined1 (*) [16])(uVar40 + 0xb0 + lVar34);
      auVar82._16_16_ = auVar65;
      auVar82._0_16_ = auVar65;
      auVar66 = vsubps_avx(auVar50,auVar69);
      auVar80 = vsubps_avx(auVar58,auVar73);
      auVar10 = vsubps_avx(auVar67,auVar77);
      auVar47 = vsubps_avx(auVar47,auVar50);
      auVar11 = vsubps_avx(_local_1360,auVar58);
      auVar12 = vsubps_avx(auVar82,auVar67);
      auVar13._4_4_ = auVar80._4_4_ * auVar12._4_4_;
      auVar13._0_4_ = auVar80._0_4_ * auVar12._0_4_;
      auVar13._8_4_ = auVar80._8_4_ * auVar12._8_4_;
      auVar13._12_4_ = auVar80._12_4_ * auVar12._12_4_;
      auVar13._16_4_ = auVar80._16_4_ * auVar12._16_4_;
      auVar13._20_4_ = auVar80._20_4_ * auVar12._20_4_;
      auVar13._24_4_ = auVar80._24_4_ * auVar12._24_4_;
      auVar13._28_4_ = auVar65._12_4_;
      auVar8 = vfmsub231ps_fma(auVar13,auVar11,auVar10);
      auVar14._4_4_ = auVar10._4_4_ * auVar47._4_4_;
      auVar14._0_4_ = auVar10._0_4_ * auVar47._0_4_;
      auVar14._8_4_ = auVar10._8_4_ * auVar47._8_4_;
      auVar14._12_4_ = auVar10._12_4_ * auVar47._12_4_;
      auVar14._16_4_ = auVar10._16_4_ * auVar47._16_4_;
      auVar14._20_4_ = auVar10._20_4_ * auVar47._20_4_;
      auVar14._24_4_ = auVar10._24_4_ * auVar47._24_4_;
      auVar14._28_4_ = auVar11._28_4_;
      auVar72 = vfmsub231ps_fma(auVar14,auVar12,auVar66);
      uVar5 = *(undefined4 *)(ray + k * 4);
      auVar74._4_4_ = uVar5;
      auVar74._0_4_ = uVar5;
      auVar74._8_4_ = uVar5;
      auVar74._12_4_ = uVar5;
      auVar74._16_4_ = uVar5;
      auVar74._20_4_ = uVar5;
      auVar74._24_4_ = uVar5;
      auVar74._28_4_ = uVar5;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar78._4_4_ = uVar5;
      auVar78._0_4_ = uVar5;
      auVar78._8_4_ = uVar5;
      auVar78._12_4_ = uVar5;
      auVar78._16_4_ = uVar5;
      auVar78._20_4_ = uVar5;
      auVar78._24_4_ = uVar5;
      auVar78._28_4_ = uVar5;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar83._4_4_ = uVar5;
      auVar83._0_4_ = uVar5;
      auVar83._8_4_ = uVar5;
      auVar83._12_4_ = uVar5;
      auVar83._16_4_ = uVar5;
      auVar83._20_4_ = uVar5;
      auVar83._24_4_ = uVar5;
      auVar83._28_4_ = uVar5;
      fVar2 = *(float *)(ray + k * 4 + 0x40);
      auVar70._4_4_ = fVar2;
      auVar70._0_4_ = fVar2;
      auVar70._8_4_ = fVar2;
      auVar70._12_4_ = fVar2;
      auVar70._16_4_ = fVar2;
      auVar70._20_4_ = fVar2;
      auVar70._24_4_ = fVar2;
      auVar70._28_4_ = fVar2;
      auVar13 = vsubps_avx(auVar50,auVar74);
      fVar3 = *(float *)(ray + k * 4 + 0x50);
      auVar51._4_4_ = fVar3;
      auVar51._0_4_ = fVar3;
      auVar51._8_4_ = fVar3;
      auVar51._12_4_ = fVar3;
      auVar51._16_4_ = fVar3;
      auVar51._20_4_ = fVar3;
      auVar51._24_4_ = fVar3;
      auVar51._28_4_ = fVar3;
      auVar14 = vsubps_avx(auVar58,auVar78);
      fVar4 = *(float *)(ray + k * 4 + 0x60);
      auVar84._4_4_ = fVar4;
      auVar84._0_4_ = fVar4;
      auVar84._8_4_ = fVar4;
      auVar84._12_4_ = fVar4;
      auVar84._16_4_ = fVar4;
      auVar84._20_4_ = fVar4;
      auVar84._24_4_ = fVar4;
      auVar84._28_4_ = fVar4;
      auVar50 = vsubps_avx(auVar67,auVar83);
      auVar18._4_4_ = fVar2 * auVar14._4_4_;
      auVar18._0_4_ = fVar2 * auVar14._0_4_;
      auVar18._8_4_ = fVar2 * auVar14._8_4_;
      auVar18._12_4_ = fVar2 * auVar14._12_4_;
      auVar18._16_4_ = fVar2 * auVar14._16_4_;
      auVar18._20_4_ = fVar2 * auVar14._20_4_;
      auVar18._24_4_ = fVar2 * auVar14._24_4_;
      auVar18._28_4_ = auVar49._12_4_;
      auVar49 = vfmsub231ps_fma(auVar18,auVar13,auVar51);
      auVar19._4_4_ = auVar49._4_4_ * auVar12._4_4_;
      auVar19._0_4_ = auVar49._0_4_ * auVar12._0_4_;
      auVar19._8_4_ = auVar49._8_4_ * auVar12._8_4_;
      auVar19._12_4_ = auVar49._12_4_ * auVar12._12_4_;
      auVar19._16_4_ = auVar12._16_4_ * 0.0;
      auVar19._20_4_ = auVar12._20_4_ * 0.0;
      auVar19._24_4_ = auVar12._24_4_ * 0.0;
      auVar19._28_4_ = auVar57._12_4_;
      auVar59._0_4_ = auVar49._0_4_ * auVar10._0_4_;
      auVar59._4_4_ = auVar49._4_4_ * auVar10._4_4_;
      auVar59._8_4_ = auVar49._8_4_ * auVar10._8_4_;
      auVar59._12_4_ = auVar49._12_4_ * auVar10._12_4_;
      auVar59._16_4_ = auVar10._16_4_ * 0.0;
      auVar59._20_4_ = auVar10._20_4_ * 0.0;
      auVar59._24_4_ = auVar10._24_4_ * 0.0;
      auVar59._28_4_ = 0;
      auVar10._4_4_ = fVar4 * auVar13._4_4_;
      auVar10._0_4_ = fVar4 * auVar13._0_4_;
      auVar10._8_4_ = fVar4 * auVar13._8_4_;
      auVar10._12_4_ = fVar4 * auVar13._12_4_;
      auVar10._16_4_ = fVar4 * auVar13._16_4_;
      auVar10._20_4_ = fVar4 * auVar13._20_4_;
      auVar10._24_4_ = fVar4 * auVar13._24_4_;
      auVar10._28_4_ = fVar2;
      auVar57 = vfmsub231ps_fma(auVar10,auVar50,auVar70);
      auVar49 = vfmadd231ps_fma(auVar19,ZEXT1632(auVar57),auVar11);
      auVar57 = vfmadd231ps_fma(auVar59,auVar80,ZEXT1632(auVar57));
      auVar12._4_4_ = auVar66._4_4_ * auVar11._4_4_;
      auVar12._0_4_ = auVar66._0_4_ * auVar11._0_4_;
      auVar12._8_4_ = auVar66._8_4_ * auVar11._8_4_;
      auVar12._12_4_ = auVar66._12_4_ * auVar11._12_4_;
      auVar12._16_4_ = auVar66._16_4_ * auVar11._16_4_;
      auVar12._20_4_ = auVar66._20_4_ * auVar11._20_4_;
      auVar12._24_4_ = auVar66._24_4_ * auVar11._24_4_;
      auVar12._28_4_ = auVar11._28_4_;
      auVar9 = vfmsub231ps_fma(auVar12,auVar47,auVar80);
      auVar71._0_4_ = fVar3 * auVar50._0_4_;
      auVar71._4_4_ = fVar3 * auVar50._4_4_;
      auVar71._8_4_ = fVar3 * auVar50._8_4_;
      auVar71._12_4_ = fVar3 * auVar50._12_4_;
      auVar71._16_4_ = fVar3 * auVar50._16_4_;
      auVar71._20_4_ = fVar3 * auVar50._20_4_;
      auVar71._24_4_ = fVar3 * auVar50._24_4_;
      auVar71._28_4_ = 0;
      auVar17 = vfmsub231ps_fma(auVar71,auVar84,auVar14);
      fVar48 = auVar9._0_4_;
      fVar53 = auVar9._4_4_;
      auVar11._4_4_ = fVar53 * fVar4;
      auVar11._0_4_ = fVar48 * fVar4;
      fVar54 = auVar9._8_4_;
      auVar11._8_4_ = fVar54 * fVar4;
      fVar55 = auVar9._12_4_;
      auVar11._12_4_ = fVar55 * fVar4;
      auVar11._16_4_ = fVar4 * 0.0;
      auVar11._20_4_ = fVar4 * 0.0;
      auVar11._24_4_ = fVar4 * 0.0;
      auVar11._28_4_ = auVar50._28_4_;
      auVar65 = vfmadd231ps_fma(auVar11,auVar51,ZEXT1632(auVar72));
      auVar65 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar70,ZEXT1632(auVar8));
      auVar52._8_4_ = 0x80000000;
      auVar52._0_8_ = 0x8000000080000000;
      auVar52._12_4_ = 0x80000000;
      auVar52._16_4_ = 0x80000000;
      auVar52._20_4_ = 0x80000000;
      auVar52._24_4_ = 0x80000000;
      auVar52._28_4_ = 0x80000000;
      auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),ZEXT1632(auVar17),auVar47);
      auVar80 = vandps_avx(ZEXT1632(auVar65),auVar52);
      uVar28 = auVar80._0_4_;
      auVar68._0_4_ = (float)(auVar49._0_4_ ^ uVar28);
      uVar29 = auVar80._4_4_;
      auVar68._4_4_ = (float)(auVar49._4_4_ ^ uVar29);
      uVar30 = auVar80._8_4_;
      auVar68._8_4_ = (float)(auVar49._8_4_ ^ uVar30);
      uVar15 = auVar80._12_4_;
      auVar68._12_4_ = (float)(auVar49._12_4_ ^ uVar15);
      fVar2 = auVar80._16_4_;
      auVar68._16_4_ = fVar2;
      fVar3 = auVar80._20_4_;
      auVar68._20_4_ = fVar3;
      fVar4 = auVar80._24_4_;
      auVar68._24_4_ = fVar4;
      fVar16 = auVar80._28_4_;
      auVar68._28_4_ = fVar16;
      auVar49 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar66,ZEXT1632(auVar17));
      local_1160._0_4_ = (float)(auVar49._0_4_ ^ uVar28);
      local_1160._4_4_ = (float)(auVar49._4_4_ ^ uVar29);
      local_1160._8_4_ = (float)(auVar49._8_4_ ^ uVar30);
      local_1160._12_4_ = (float)(auVar49._12_4_ ^ uVar15);
      local_1160._16_4_ = fVar2;
      local_1160._20_4_ = fVar3;
      local_1160._24_4_ = fVar4;
      local_1160._28_4_ = fVar16;
      auVar80 = vcmpps_avx(auVar68,ZEXT832(0) << 0x20,5);
      auVar66 = vcmpps_avx(local_1160,ZEXT832(0) << 0x20,5);
      auVar80 = vandps_avx(auVar80,auVar66);
      auVar60._8_4_ = 0x7fffffff;
      auVar60._0_8_ = 0x7fffffff7fffffff;
      auVar60._12_4_ = 0x7fffffff;
      auVar60._16_4_ = 0x7fffffff;
      auVar60._20_4_ = 0x7fffffff;
      auVar60._24_4_ = 0x7fffffff;
      auVar60._28_4_ = 0x7fffffff;
      local_1120 = vandps_avx(ZEXT1632(auVar65),auVar60);
      auVar66 = vcmpps_avx(ZEXT1632(auVar65),ZEXT832(0) << 0x20,4);
      auVar80 = vandps_avx(auVar80,auVar66);
      auVar79._0_4_ = auVar68._0_4_ + local_1160._0_4_;
      auVar79._4_4_ = auVar68._4_4_ + local_1160._4_4_;
      auVar79._8_4_ = auVar68._8_4_ + local_1160._8_4_;
      auVar79._12_4_ = auVar68._12_4_ + local_1160._12_4_;
      auVar79._16_4_ = fVar2 + fVar2;
      auVar79._20_4_ = fVar3 + fVar3;
      auVar79._24_4_ = fVar4 + fVar4;
      auVar79._28_4_ = fVar16 + fVar16;
      auVar66 = vcmpps_avx(auVar79,local_1120,2);
      auVar10 = auVar66 & auVar80;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar80 = vandps_avx(auVar80,auVar66);
        auVar49 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
        auVar20._4_4_ = fVar53 * auVar50._4_4_;
        auVar20._0_4_ = fVar48 * auVar50._0_4_;
        auVar20._8_4_ = fVar54 * auVar50._8_4_;
        auVar20._12_4_ = fVar55 * auVar50._12_4_;
        auVar20._16_4_ = auVar50._16_4_ * 0.0;
        auVar20._20_4_ = auVar50._20_4_ * 0.0;
        auVar20._24_4_ = auVar50._24_4_ * 0.0;
        auVar20._28_4_ = 0;
        auVar57 = vfmadd132ps_fma(auVar14,auVar20,ZEXT1632(auVar72));
        auVar57 = vfmadd132ps_fma(auVar13,ZEXT1632(auVar57),ZEXT1632(auVar8));
        local_1140._0_4_ = (float)(auVar57._0_4_ ^ uVar28);
        local_1140._4_4_ = (float)(auVar57._4_4_ ^ uVar29);
        local_1140._8_4_ = (float)(auVar57._8_4_ ^ uVar30);
        local_1140._12_4_ = (float)(auVar57._12_4_ ^ uVar15);
        local_1140._16_4_ = fVar2;
        local_1140._20_4_ = fVar3;
        local_1140._24_4_ = fVar4;
        local_1140._28_4_ = fVar16;
        fVar56 = *(float *)(ray + k * 4 + 0x30);
        auVar21._4_4_ = local_1120._4_4_ * fVar56;
        auVar21._0_4_ = local_1120._0_4_ * fVar56;
        auVar21._8_4_ = local_1120._8_4_ * fVar56;
        auVar21._12_4_ = local_1120._12_4_ * fVar56;
        auVar21._16_4_ = local_1120._16_4_ * fVar56;
        auVar21._20_4_ = local_1120._20_4_ * fVar56;
        auVar21._24_4_ = local_1120._24_4_ * fVar56;
        auVar21._28_4_ = fVar56;
        auVar80 = vcmpps_avx(auVar21,local_1140,1);
        fVar56 = *(float *)(ray + k * 4 + 0x80);
        auVar22._4_4_ = local_1120._4_4_ * fVar56;
        auVar22._0_4_ = local_1120._0_4_ * fVar56;
        auVar22._8_4_ = local_1120._8_4_ * fVar56;
        auVar22._12_4_ = local_1120._12_4_ * fVar56;
        auVar22._16_4_ = local_1120._16_4_ * fVar56;
        auVar22._20_4_ = local_1120._20_4_ * fVar56;
        auVar22._24_4_ = local_1120._24_4_ * fVar56;
        auVar22._28_4_ = fVar56;
        auVar66 = vcmpps_avx(local_1140,auVar22,2);
        auVar80 = vandps_avx(auVar66,auVar80);
        auVar57 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
        auVar49 = vpand_avx(auVar49,auVar57);
        auVar80 = vpmovzxwd_avx2(auVar49);
        auVar80 = vpslld_avx2(auVar80,0x1f);
        if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar80 >> 0x7f,0) != '\0') ||
              (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar80 >> 0xbf,0) != '\0') ||
            (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar80[0x1f] < '\0') {
          local_12c0 = vpsrad_avx2(auVar80,0x1f);
          local_1180 = auVar68;
          local_1360 = auVar8._0_8_;
          uStack_1358 = auVar8._8_8_;
          local_1100 = local_1360;
          uStack_10f8 = uStack_1358;
          uStack_10f0 = 0;
          uStack_10e8 = 0;
          local_1320 = auVar72._0_8_;
          uStack_1318 = auVar72._8_8_;
          local_10e0 = local_1320;
          uStack_10d8 = uStack_1318;
          uStack_10d0 = 0;
          uStack_10c8 = 0;
          local_1380 = auVar9._0_8_;
          uStack_1378 = auVar9._8_8_;
          local_10c0 = local_1380;
          uStack_10b8 = uStack_1378;
          uStack_10b0 = 0;
          uStack_10a8 = 0;
          local_10a0 = local_12c0;
          local_fc0 = local_1280;
          auVar66 = vrcpps_avx(local_1120);
          auVar75._8_4_ = 0x3f800000;
          auVar75._0_8_ = 0x3f8000003f800000;
          auVar75._12_4_ = 0x3f800000;
          auVar75._16_4_ = 0x3f800000;
          auVar75._20_4_ = 0x3f800000;
          auVar75._24_4_ = 0x3f800000;
          auVar75._28_4_ = 0x3f800000;
          auVar57 = vfnmadd213ps_fma(local_1120,auVar66,auVar75);
          auVar57 = vfmadd132ps_fma(ZEXT1632(auVar57),auVar66,auVar66);
          fVar56 = auVar57._0_4_;
          fVar62 = auVar57._4_4_;
          auVar23._4_4_ = fVar62 * local_1140._4_4_;
          auVar23._0_4_ = fVar56 * local_1140._0_4_;
          fVar63 = auVar57._8_4_;
          auVar23._8_4_ = fVar63 * local_1140._8_4_;
          fVar64 = auVar57._12_4_;
          auVar23._12_4_ = fVar64 * local_1140._12_4_;
          auVar23._16_4_ = fVar2 * 0.0;
          auVar23._20_4_ = fVar3 * 0.0;
          auVar23._24_4_ = fVar4 * 0.0;
          auVar23._28_4_ = auVar66._28_4_;
          local_1040 = auVar23;
          auVar24._4_4_ = fVar62 * auVar68._4_4_;
          auVar24._0_4_ = fVar56 * auVar68._0_4_;
          auVar24._8_4_ = fVar63 * auVar68._8_4_;
          auVar24._12_4_ = fVar64 * auVar68._12_4_;
          auVar24._16_4_ = fVar2 * 0.0;
          auVar24._20_4_ = fVar3 * 0.0;
          auVar24._24_4_ = fVar4 * 0.0;
          auVar24._28_4_ = fVar16;
          auVar66 = vminps_avx(auVar24,auVar75);
          auVar61._0_4_ = fVar56 * local_1160._0_4_;
          auVar61._4_4_ = fVar62 * local_1160._4_4_;
          auVar61._8_4_ = fVar63 * local_1160._8_4_;
          auVar61._12_4_ = fVar64 * local_1160._12_4_;
          auVar61._16_4_ = fVar2 * 0.0;
          auVar61._20_4_ = fVar3 * 0.0;
          auVar61._24_4_ = fVar4 * 0.0;
          auVar61._28_4_ = 0;
          auVar10 = vminps_avx(auVar61,auVar75);
          auVar47 = vsubps_avx(auVar75,auVar66);
          auVar11 = vsubps_avx(auVar75,auVar10);
          local_1060 = vblendvps_avx(auVar10,auVar47,local_1280);
          local_1080 = vblendvps_avx(auVar66,auVar11,local_1280);
          local_1360._0_4_ = auVar8._0_4_;
          local_1360._4_4_ = auVar8._4_4_;
          uStack_1358._0_4_ = auVar8._8_4_;
          uStack_1358._4_4_ = auVar8._12_4_;
          local_1320._0_4_ = auVar72._0_4_;
          local_1320._4_4_ = auVar72._4_4_;
          uStack_1318._0_4_ = auVar72._8_4_;
          uStack_1318._4_4_ = auVar72._12_4_;
          local_1020[0] = (float)local_12a0._0_4_ * (float)local_1360._0_4_;
          local_1020[1] = (float)local_12a0._4_4_ * (float)local_1360._4_4_;
          local_1020[2] = fStack_1298 * (float)uStack_1358;
          local_1020[3] = fStack_1294 * uStack_1358._4_4_;
          fStack_1010 = fStack_1290 * 0.0;
          fStack_100c = fStack_128c * 0.0;
          fStack_1008 = fStack_1288 * 0.0;
          uStack_1004 = local_1080._28_4_;
          local_1000[0] = (float)local_12a0._0_4_ * (float)local_1320;
          local_1000[1] = (float)local_12a0._4_4_ * local_1320._4_4_;
          local_1000[2] = fStack_1298 * (float)uStack_1318;
          local_1000[3] = fStack_1294 * uStack_1318._4_4_;
          fStack_ff0 = fStack_1290 * 0.0;
          fStack_fec = fStack_128c * 0.0;
          fStack_fe8 = fStack_1288 * 0.0;
          uStack_fe4 = auVar66._28_4_;
          local_fe0[0] = (float)local_12a0._0_4_ * fVar48;
          local_fe0[1] = (float)local_12a0._4_4_ * fVar53;
          local_fe0[2] = fStack_1298 * fVar54;
          local_fe0[3] = fStack_1294 * fVar55;
          fStack_fd0 = fStack_1290 * 0.0;
          fStack_fcc = fStack_128c * 0.0;
          fStack_fc8 = fStack_1288 * 0.0;
          uStack_fc4 = uStack_1284;
          auVar76._8_4_ = 0x7f800000;
          auVar76._0_8_ = 0x7f8000007f800000;
          auVar76._12_4_ = 0x7f800000;
          auVar76._16_4_ = 0x7f800000;
          auVar76._20_4_ = 0x7f800000;
          auVar76._24_4_ = 0x7f800000;
          auVar76._28_4_ = 0x7f800000;
          auVar80 = vblendvps_avx(auVar76,auVar23,auVar80);
          auVar66 = vshufps_avx(auVar80,auVar80,0xb1);
          auVar66 = vminps_avx(auVar80,auVar66);
          auVar10 = vshufpd_avx(auVar66,auVar66,5);
          auVar66 = vminps_avx(auVar66,auVar10);
          auVar10 = vpermpd_avx2(auVar66,0x4e);
          auVar66 = vminps_avx(auVar66,auVar10);
          auVar80 = vcmpps_avx(auVar80,auVar66,0);
          auVar57 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
          auVar49 = vpand_avx(auVar57,auVar49);
          auVar80 = vpmovzxwd_avx2(auVar49);
          auVar80 = vpslld_avx2(auVar80,0x1f);
          if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar80 >> 0x7f,0) == '\0') &&
                (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar80 >> 0xbf,0) == '\0') &&
              (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar80[0x1f]) {
            auVar80 = local_12c0;
          }
          uVar29 = vmovmskps_avx(auVar80);
          uVar28 = 0;
          for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x80000000) {
            uVar28 = uVar28 + 1;
          }
          pRVar7 = (context->scene->geometries).items;
          uVar29 = *(uint *)(ray + k * 4 + 0x90);
          while( true ) {
            uVar31 = (ulong)uVar28;
            uVar28 = *(uint *)((long)&local_11a0 + uVar31 * 4);
            if (((pRVar7[uVar28].ptr)->mask & uVar29) != 0) break;
            *(undefined4 *)(local_12c0 + uVar31 * 4) = 0;
            if ((((((((local_12c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_12c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_12c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_12c0 >> 0x7f,0) == '\0') &&
                  (local_12c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_12c0 >> 0xbf,0) == '\0') &&
                (local_12c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_12c0[0x1f]) goto LAB_015822d7;
            auVar80 = vblendvps_avx(auVar76,auVar23,local_12c0);
            auVar66 = vshufps_avx(auVar80,auVar80,0xb1);
            auVar66 = vminps_avx(auVar80,auVar66);
            auVar10 = vshufpd_avx(auVar66,auVar66,5);
            auVar66 = vminps_avx(auVar66,auVar10);
            auVar10 = vpermpd_avx2(auVar66,0x4e);
            auVar66 = vminps_avx(auVar66,auVar10);
            auVar66 = vcmpps_avx(auVar80,auVar66,0);
            auVar10 = local_12c0 & auVar66;
            auVar80 = local_12c0;
            if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0x7f,0) != '\0') ||
                  (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0xbf,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar10[0x1f] < '\0') {
              auVar80 = vandps_avx(auVar66,local_12c0);
            }
            uVar30 = vmovmskps_avx(auVar80);
            uVar28 = 0;
            for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x80000000) {
              uVar28 = uVar28 + 1;
            }
          }
          uVar5 = *(undefined4 *)(local_1080 + uVar31 * 4);
          uVar6 = *(undefined4 *)(local_1060 + uVar31 * 4);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1040 + uVar31 * 4);
          *(float *)(ray + k * 4 + 0xc0) = local_1020[uVar31];
          *(float *)(ray + k * 4 + 0xd0) = local_1000[uVar31];
          *(float *)(ray + k * 4 + 0xe0) = local_fe0[uVar31];
          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar5;
          *(undefined4 *)(ray + k * 4 + 0x100) = uVar6;
          *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_11c0 + uVar31 * 4);
          *(uint *)(ray + k * 4 + 0x120) = uVar28;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
        }
      }
LAB_015822d7:
    }
    uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar81 = ZEXT1664(CONCAT412(uVar5,CONCAT48(uVar5,CONCAT44(uVar5,uVar5))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }